

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  path local_30;
  
  path<char[1],ghc::filesystem::path>(&local_30,source,auto_format);
  operator/=(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(source));
}